

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O1

IOTHUB_AUTHORIZATION_HANDLE IoTHubClient_Auth_CreateFromDeviceAuth(char *device_id,char *module_id)

{
  DEVICE_AUTH_TYPE DVar1;
  IOTHUB_AUTHORIZATION_DATA *__ptr;
  IOTHUB_SECURITY_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (device_id == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Invalid Parameter device_id: %p";
      iVar3 = 0xa8;
LAB_00128e0d:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_CreateFromDeviceAuth",iVar3,1,pcVar4);
      return (IOTHUB_AUTHORIZATION_HANDLE)0x0;
    }
  }
  else {
    __ptr = initialize_auth_client(device_id,module_id);
    if (__ptr == (IOTHUB_AUTHORIZATION_DATA *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Failure initializing auth client";
        iVar3 = 0xb1;
        goto LAB_00128e0d;
      }
    }
    else {
      handle = iothub_device_auth_create();
      __ptr->device_auth_handle = handle;
      if (handle != (IOTHUB_SECURITY_HANDLE)0x0) {
        DVar1 = iothub_device_auth_get_type(handle);
        if ((DVar1 & ~AUTH_TYPE_X509) == AUTH_TYPE_SAS) {
          __ptr->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH;
          return __ptr;
        }
        __ptr->cred_type = IOTHUB_CREDENTIAL_TYPE_X509_ECC;
        return __ptr;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                  ,"IoTHubClient_Auth_CreateFromDeviceAuth",0xb8,1,
                  "Failed allocating IOTHUB_AUTHORIZATION_DATA");
      }
      free(__ptr->device_id);
      free(__ptr->module_id);
      free(__ptr);
    }
  }
  return (IOTHUB_AUTHORIZATION_HANDLE)0x0;
}

Assistant:

IOTHUB_AUTHORIZATION_HANDLE IoTHubClient_Auth_CreateFromDeviceAuth(const char* device_id, const char* module_id)
{
    IOTHUB_AUTHORIZATION_DATA* result;
    if (device_id == NULL)
    {
        LogError("Invalid Parameter device_id: %p", device_id);
        result = NULL;
    }
    else
    {
#ifdef USE_PROV_MODULE
        result = initialize_auth_client(device_id, module_id);
        if (result == NULL)
        {
            LogError("Failure initializing auth client");
        }
        else
        {
            result->device_auth_handle = iothub_device_auth_create();
            if (result->device_auth_handle == NULL)
            {
                LogError("Failed allocating IOTHUB_AUTHORIZATION_DATA");
                free(result->device_id);
                free(result->module_id);
                free(result);
                result = NULL;
            }
            else
            {
                DEVICE_AUTH_TYPE auth_type = iothub_device_auth_get_type(result->device_auth_handle);
                if (auth_type == AUTH_TYPE_SAS || auth_type == AUTH_TYPE_SYMM_KEY)
                {
                    result->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH;
                }
                else
                {
                    result->cred_type = IOTHUB_CREDENTIAL_TYPE_X509_ECC;
                }
            }
        }
#else
        (void)module_id;
        LogError("Failed HSM module is not supported");
        result = NULL;
#endif
    }
    return result;
}